

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O3

void __thiscall helics::CommonCore::processExecRequest(CommonCore *this,ActionMessage *cmd)

{
  int iVar1;
  pointer ppVar2;
  BaseTimeCoordinator *pBVar3;
  string_view message;
  bool bVar4;
  int iVar5;
  mapped_type *this_00;
  pair<helics::GlobalFederateId,_int> *block;
  pointer ppVar6;
  GlobalFederateId *dep;
  pointer pGVar7;
  string_view name;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> local_48;
  undefined8 local_30;
  char *pcStack_28;
  
  bVar4 = isLocal(this,(GlobalFederateId)(cmd->source_id).gid);
  if (bVar4) {
    ppVar6 = (this->timeBlocks).
             super__Vector_base<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar2 = (this->timeBlocks).
             super__Vector_base<std::pair<helics::GlobalFederateId,_int>,_std::allocator<std::pair<helics::GlobalFederateId,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar6 != ppVar2) {
      iVar5 = (cmd->source_id).gid;
      do {
        if ((ppVar6->first).gid == iVar5) {
          if (ppVar6->second != 0) {
            local_48.
            super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>.
            _M_impl.super__Vector_impl_data._M_start._0_4_ = iVar5;
            this_00 = std::
                      map<int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
                      ::operator[](&this->delayedTimingMessages,(key_type_conflict2 *)&local_48);
            std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
                      (this_00,cmd);
            return;
          }
          break;
        }
        ppVar6 = ppVar6 + 1;
      } while (ppVar6 != ppVar2);
    }
  }
  iVar5 = (this->super_BrokerBase).global_broker_id_local.gid;
  iVar1 = (cmd->dest_id).gid;
  if (iVar1 == iVar5) {
    pBVar3 = (this->super_BrokerBase).timeCoord._M_t.
             super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
             .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
    (*pBVar3->_vptr_BaseTimeCoordinator[3])(pBVar3,cmd);
    if ((this->super_BrokerBase).enteredExecutionMode == false) {
      pBVar3 = (this->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
      iVar5 = (*pBVar3->_vptr_BaseTimeCoordinator[9])(pBVar3,0x8831d580);
      if ((char)iVar5 != '\0') {
        (*((this->super_BrokerBase).timeCoord._M_t.
           super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
           ._M_t.
           super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
           .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl)->
          _vptr_BaseTimeCoordinator[2])();
        return;
      }
      (this->super_BrokerBase).enteredExecutionMode = true;
      if (0xe < (this->super_BrokerBase).maxLogLevel.super___atomic_base<int>._M_i) {
        local_30 = 0x12;
        pcStack_28 = "entering Exec Mode";
        message._M_str = "entering Exec Mode";
        message._M_len = 0x12;
        name._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
        name._M_len = (this->super_BrokerBase).identifier._M_string_length;
        BrokerBase::sendToLogger
                  (&this->super_BrokerBase,
                   (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,0xf,name,
                   message,false);
      }
    }
  }
  else {
    if (((iVar1 != -1700000000) && (iVar1 != -2010000000)) || ((cmd->source_id).gid != iVar5)) {
      routeMessage(this,cmd);
      return;
    }
    BaseTimeCoordinator::getDependents
              (&local_48,
               (this->super_BrokerBase).timeCoord._M_t.
               super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
               .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl);
    pGVar7 = (pointer)CONCAT44(local_48.
                               super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                               (int)local_48.
                                    super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
    if (pGVar7 != local_48.
                  super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        routeMessage(this,cmd,(GlobalFederateId)pGVar7->gid);
        pGVar7 = pGVar7 + 1;
      } while (pGVar7 != local_48.
                         super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
      pGVar7 = (pointer)CONCAT44(local_48.
                                 super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (int)local_48.
                                      super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (pGVar7 != (pointer)0x0) {
      operator_delete(pGVar7,(long)local_48.
                                   super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pGVar7
                     );
    }
  }
  return;
}

Assistant:

void CommonCore::processExecRequest(ActionMessage& cmd)
{
    if (isLocal(GlobalBrokerId{cmd.source_id})) {
        if (hasTimeBlock(cmd.source_id)) {
            delayedTimingMessages[cmd.source_id.baseValue()].push_back(cmd);
            return;
        }
    }
    if (cmd.dest_id == global_broker_id_local) {
        timeCoord->processTimeMessage(cmd);
        if (!enteredExecutionMode) {
            auto res = timeCoord->checkExecEntry();
            if (res == MessageProcessingResult::NEXT_STEP) {
                enteredExecutionMode = true;
                LOG_TIMING(global_broker_id_local, getIdentifier(), "entering Exec Mode");
            } else {
                timeCoord->updateTimeFactors();
            }
        }
    } else if (!cmd.dest_id.isValid() && cmd.source_id == global_broker_id_local) {
        for (auto& dep : timeCoord->getDependents()) {
            routeMessage(cmd, dep);
        }
    } else {
        routeMessage(cmd);
    }
}